

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bbdpre.c
# Opt level: O1

int CVBBDPrecInitB(void *cvode_mem,int which,sunindextype NlocalB,sunindextype mudqB,
                  sunindextype mldqB,sunindextype mukeepB,sunindextype mlkeepB,sunrealtype dqrelyB,
                  CVLocalFnB glocB,CVCommFnB cfnB)

{
  int iVar1;
  undefined8 *puVar2;
  int iVar3;
  int error_code;
  char *msgfmt;
  int *piVar4;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar3 = -1;
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    iVar1 = 0x308;
  }
  else if (*(int *)((long)cvode_mem + 0xa78) == 0) {
    msgfmt = "Illegal attempt to call before calling CVodeAdjInit.";
    iVar3 = -0x65;
    error_code = -0x65;
    iVar1 = 0x311;
  }
  else if (which < *(int *)(*(long *)((long)cvode_mem + 0xa70) + 0x38)) {
    for (piVar4 = *(int **)(*(long *)((long)cvode_mem + 0xa70) + 0x30);
        (piVar4 != (int *)0x0 && (*piVar4 != which)); piVar4 = *(int **)(piVar4 + 0x1e)) {
    }
    iVar1 = CVBBDPrecInit(*(void **)(piVar4 + 4),NlocalB,mudqB,mldqB,mukeepB,mlkeepB,dqrelyB,
                          cvGlocWrapper,cvCfnWrapper);
    if (iVar1 != 0) {
      return iVar1;
    }
    puVar2 = (undefined8 *)malloc(0x10);
    if (puVar2 != (undefined8 *)0x0) {
      *puVar2 = glocB;
      puVar2[1] = cfnB;
      *(undefined8 **)(piVar4 + 0x16) = puVar2;
      *(code **)(piVar4 + 0x18) = CVBBDPrecFreeB;
      return 0;
    }
    msgfmt = "A memory request failed.";
    iVar3 = -4;
    error_code = -4;
    iVar1 = 0x335;
  }
  else {
    msgfmt = "Illegal value for the which parameter.";
    iVar3 = -3;
    error_code = -3;
    iVar1 = 0x31a;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar1,"CVBBDPrecInitB",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                 ,msgfmt);
  return iVar3;
}

Assistant:

int CVBBDPrecInitB(void* cvode_mem, int which, sunindextype NlocalB,
                   sunindextype mudqB, sunindextype mldqB, sunindextype mukeepB,
                   sunindextype mlkeepB, sunrealtype dqrelyB, CVLocalFnB glocB,
                   CVCommFnB cfnB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVBBDPrecDataB cvbbdB_mem;
  void* cvodeB_mem;
  int flag;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CVLS_NO_ADJ, __LINE__, __func__, __FILE__,
                   MSGBBD_NO_ADJ);
    return (CVLS_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGBBD_BAD_WHICH);
    return (CVLS_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    /* advance */
    cvB_mem = cvB_mem->cv_next;
  }
  /* cv_mem corresponding to 'which' problem. */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);

  /* Initialize the BBD preconditioner for this backward problem. */
  flag = CVBBDPrecInit(cvodeB_mem, NlocalB, mudqB, mldqB, mukeepB, mlkeepB,
                       dqrelyB, cvGlocWrapper, cvCfnWrapper);
  if (flag != CV_SUCCESS) { return (flag); }

  /* Allocate memory for CVBBDPrecDataB to store the user-provided
     functions which will be called from the wrappers */
  cvbbdB_mem = NULL;
  cvbbdB_mem = (CVBBDPrecDataB)malloc(sizeof(*cvbbdB_mem));
  if (cvbbdB_mem == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* set pointers to user-provided functions */
  cvbbdB_mem->glocB = glocB;
  cvbbdB_mem->cfnB  = cfnB;

  /* Attach pmem and pfree */
  cvB_mem->cv_pmem  = cvbbdB_mem;
  cvB_mem->cv_pfree = CVBBDPrecFreeB;

  return (CVLS_SUCCESS);
}